

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

void __thiscall cdnsBlockTables::clear(cdnsBlockTables *this)

{
  cdnsBlockTables *this_local;
  
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::clear(&this->addresses);
  std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::clear(&this->class_ids);
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::clear(&this->name_rdata);
  std::vector<cdns_query_signature,_std::allocator<cdns_query_signature>_>::clear(&this->q_sigs);
  std::vector<cdns_question_list,_std::allocator<cdns_question_list>_>::clear(&this->question_list);
  std::vector<cdns_question,_std::allocator<cdns_question>_>::clear(&this->qrr);
  std::vector<cdns_rr_list,_std::allocator<cdns_rr_list>_>::clear(&this->rr_list);
  std::vector<cdns_rr_field,_std::allocator<cdns_rr_field>_>::clear(&this->rrs);
  this->current_block = (cdnsBlock *)0x0;
  this->is_filled = false;
  return;
}

Assistant:

void cdnsBlockTables::clear()
{
    addresses.clear();
    class_ids.clear();
    name_rdata.clear();
    q_sigs.clear();
    question_list.clear();
    qrr.clear();
    rr_list.clear();
    rrs.clear();
    current_block = NULL;
    is_filled = false;
}